

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O1

int lib::base::Require(State *state)

{
  bool bVar1;
  String *this;
  string module;
  StackAPI api;
  string local_40;
  StackAPI local_20;
  
  luna::StackAPI::StackAPI(&local_20,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_20,1,ValueT_String);
  if (bVar1) {
    this = luna::StackAPI::GetString(&local_20,0);
    luna::String::GetStdString_abi_cxx11_(&local_40,this);
    bVar1 = luna::State::IsModuleLoaded(state,&local_40);
    if (!bVar1) {
      luna::State::DoModule(state,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return 0;
}

Assistant:

int Require(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto module = api.GetString(0)->GetStdString();
        if (!state->IsModuleLoaded(module))
            state->DoModule(module);

        return 0;
    }